

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O3

bool __thiscall SQFuncState::IsConstant(SQFuncState *this,SQObject *name,SQObject *e)

{
  SQUnsignedInteger *pSVar1;
  SQTable *this_00;
  bool bVar2;
  SQObjectPtr val;
  SQObjectPtr local_30;
  SQObjectPtr local_20;
  
  local_30.super_SQObject._type = OT_NULL;
  local_30.super_SQObject._unVal.pTable = (SQTable *)0x0;
  this_00 = (this->_sharedstate->_consts).super_SQObject._unVal.pTable;
  local_20.super_SQObject._type = name->_type;
  local_20.super_SQObject._unVal = (SQObjectValue)(name->_unVal).pTable;
  if ((local_20.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((local_20.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  bVar2 = SQTable::Get(this_00,&local_20,&local_30);
  SQObjectPtr::~SQObjectPtr(&local_20);
  if (bVar2) {
    *(ulong *)e = CONCAT44(local_30.super_SQObject._4_4_,local_30.super_SQObject._type);
    (e->_unVal).pTable = (SQTable *)local_30.super_SQObject._unVal;
  }
  SQObjectPtr::~SQObjectPtr(&local_30);
  return bVar2;
}

Assistant:

bool SQFuncState::IsConstant(const SQObject &name,SQObject &e)
{
    SQObjectPtr val;
    if(_table(_sharedstate->_consts)->Get(name,val)) {
        e = val;
        return true;
    }
    return false;
}